

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall
irr::video::CNullDriver::makeColorKeyTexture(CNullDriver *this,ITexture *texture,SColor color)

{
  uint uVar1;
  uint uVar2;
  u16 uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  char *this_00;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  long lVar5;
  
  if (texture == (ITexture *)0x0) {
    return;
  }
  if (texture->ColorFormat == ECF_A1R5G5B5) {
    iVar4 = (**texture->_vptr_ITexture)(texture,0,0,0,1);
    lVar5 = CONCAT44(extraout_var_00,iVar4);
    in_XMM0_Qa = extraout_XMM0_Qa_00;
    if (lVar5 != 0) {
      uVar1 = texture->Pitch;
      uVar2 = (texture->Size).Height;
      uVar3 = A8R8G8B8toA1R5G5B5(color.color);
      for (lVar6 = 0; (uVar1 >> 1) * uVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
        if ((*(ushort *)(lVar5 + lVar6 * 2) & 0x7fff) == (uVar3 & 0x7fff)) {
          *(u16 *)(lVar5 + lVar6 * 2) = uVar3 & 0x7fff;
        }
      }
LAB_001ec540:
      (*texture->_vptr_ITexture[1])(texture);
      (*texture->_vptr_ITexture[2])(texture,0,0);
      return;
    }
  }
  else {
    if (texture->ColorFormat != ECF_A8R8G8B8) {
      this_00 = "Error: Unsupported texture color format for making color key channel.";
      goto LAB_001ec573;
    }
    iVar4 = (**texture->_vptr_ITexture)(texture,0,0,0,1);
    lVar5 = CONCAT44(extraout_var,iVar4);
    in_XMM0_Qa = extraout_XMM0_Qa;
    if (lVar5 != 0) {
      uVar1 = texture->Pitch;
      uVar2 = (texture->Size).Height;
      for (lVar6 = 0; (uVar1 >> 2) * uVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
        if ((*(uint *)(lVar5 + lVar6 * 4) & 0xffffff) == (color.color & 0xffffff)) {
          *(u32 *)(lVar5 + lVar6 * 4) = color.color & 0xffffff;
        }
      }
      goto LAB_001ec540;
    }
  }
  this_00 = "Could not lock texture for making color key channel.";
LAB_001ec573:
  os::Printer::log((Printer *)this_00,in_XMM0_Qa);
  return;
}

Assistant:

void CNullDriver::makeColorKeyTexture(video::ITexture *texture,
		video::SColor color) const
{
	if (!texture)
		return;

	if (texture->getColorFormat() != ECF_A1R5G5B5 &&
			texture->getColorFormat() != ECF_A8R8G8B8) {
		os::Printer::log("Error: Unsupported texture color format for making color key channel.", ELL_ERROR);
		return;
	}

	if (texture->getColorFormat() == ECF_A1R5G5B5) {
		u16 *p = (u16 *)texture->lock();

		if (!p) {
			os::Printer::log("Could not lock texture for making color key channel.", ELL_ERROR);
			return;
		}

		const core::dimension2d<u32> dim = texture->getSize();
		const u32 pitch = texture->getPitch() / 2;

		// color with alpha disabled (i.e. fully transparent)
		const u16 refZeroAlpha = (0x7fff & color.toA1R5G5B5());

		const u32 pixels = pitch * dim.Height;

		for (u32 pixel = 0; pixel < pixels; ++pixel) {
			// If the color matches the reference color, ignoring alphas,
			// set the alpha to zero.
			if (((*p) & 0x7fff) == refZeroAlpha)
				(*p) = refZeroAlpha;

			++p;
		}

		texture->unlock();
	} else {
		u32 *p = (u32 *)texture->lock();

		if (!p) {
			os::Printer::log("Could not lock texture for making color key channel.", ELL_ERROR);
			return;
		}

		core::dimension2d<u32> dim = texture->getSize();
		u32 pitch = texture->getPitch() / 4;

		// color with alpha disabled (fully transparent)
		const u32 refZeroAlpha = 0x00ffffff & color.color;

		const u32 pixels = pitch * dim.Height;
		for (u32 pixel = 0; pixel < pixels; ++pixel) {
			// If the color matches the reference color, ignoring alphas,
			// set the alpha to zero.
			if (((*p) & 0x00ffffff) == refZeroAlpha)
				(*p) = refZeroAlpha;

			++p;
		}

		texture->unlock();
	}
	texture->regenerateMipMapLevels();
}